

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O3

void ConvertTexture(shared_ptr<Assimp::COB::Texture> *tex,aiMaterial *out,aiTextureType type)

{
  element_type *peVar1;
  ulong uVar2;
  size_t __n;
  aiString path;
  aiString local_424;
  
  peVar1 = (tex->super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar2 = (peVar1->path)._M_string_length;
  __n = 0x3ff;
  if ((uVar2 & 0xfffffc00) == 0) {
    __n = uVar2 & 0xffffffff;
  }
  local_424.length = (ai_uint32)__n;
  memcpy(local_424.data,(peVar1->path)._M_dataplus._M_p,__n);
  local_424.data[__n] = '\0';
  aiMaterial::AddProperty(out,&local_424,"$tex.file",type,0);
  aiMaterial::AddBinaryProperty
            (out,&((tex->super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->transform,0x14,"$tex.uvtrafo",type,0,aiPTI_Float);
  return;
}

Assistant:

void ConvertTexture(std::shared_ptr< Texture > tex, aiMaterial* out, aiTextureType type)
{
    const aiString path( tex->path );
    out->AddProperty(&path,AI_MATKEY_TEXTURE(type,0));
    out->AddProperty(&tex->transform,1,AI_MATKEY_UVTRANSFORM(type,0));
}